

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

VariablePtr __thiscall libcellml::Component::takeVariable(Component *this,size_t index)

{
  long lVar1;
  __shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  VariablePtr VVar3;
  
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)0x0;
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
       (EntityImpl *)0x0;
  lVar1 = *(long *)(index + 8);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      (*(long *)(lVar1 + 0xd0) - *(long *)(lVar1 + 200) >> 4)) {
    p_Var2 = &std::
              vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
              ::at((vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
                    *)(lVar1 + 200),(size_type)in_RDX._M_pi)->
              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
    removeVariable((Component *)index,(size_t)in_RDX._M_pi);
    in_RDX._M_pi = extraout_RDX;
  }
  VVar3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  VVar3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariablePtr)VVar3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePtr Component::takeVariable(size_t index)
{
    VariablePtr variable = nullptr;
    if (index < pFunc()->mVariables.size()) {
        variable = pFunc()->mVariables.at(index);
        removeVariable(index);
    }

    return variable;
}